

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

void __thiscall gmath::Camera::Camera(Camera *this)

{
  this->_vptr_Camera = (_func_int **)&PTR__Camera_00173850;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  SMatrix<double,_3,_3>::SMatrix(&this->R);
  SVector<double,_3>::SVector(&this->T);
  (this->match).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->match).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->match).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->width = 0;
  this->height = 0;
  *(undefined4 *)&this->zmin = 0;
  *(undefined4 *)((long)&this->zmin + 4) = 0;
  *(undefined4 *)&this->zmax = 0xffffffff;
  *(undefined4 *)((long)&this->zmax + 4) = 0x7fefffff;
  return;
}

Assistant:

Camera() { width=0; height=0; zmin=0; zmax=std::numeric_limits<double>::max(); }